

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O3

void __thiscall
choc::value::Type::addArrayElements(Type *this,Type *elementType,uint32_t numElementsToAdd)

{
  uint32_t *puVar1;
  char **ppcVar2;
  Content *pCVar3;
  uint uVar4;
  uint32_t uVar5;
  MemberNameAndType *pMVar6;
  RepeatedGroup *pRVar7;
  Object *pOVar8;
  uint uVar9;
  uint7 extraout_var;
  uint7 extraout_var_00;
  AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *this_00;
  Allocator *pAVar10;
  MainType MVar11;
  undefined8 unaff_RBP;
  uint7 uVar13;
  ulong uVar12;
  MainType MVar14;
  Object *this_01;
  Object *pOVar15;
  bool bVar16;
  undefined8 local_98;
  Allocator *local_78;
  byte local_68;
  undefined8 local_48;
  Object *pOStack_40;
  
  MVar14 = elementType->mainType;
  if (MVar14 == void_) {
    throwError("Element type cannot be void");
  }
  if (this->mainType != primitiveArray) {
    if (this->mainType != complexArray) {
      throwError("Cannot add new elements to this type");
    }
    this_00 = &((this->content).complexArray)->groups;
    goto LAB_001cad6c;
  }
  uVar4 = (this->content).primitiveArray.numVectorElements;
  MVar11 = (this->content).vector.elementType;
  if (uVar4 == 0) {
    local_98 = (Object *)0x0;
  }
  else {
    if (0x100 < uVar4) goto LAB_001caec4;
    local_98 = (Object *)CONCAT44(uVar4,(uint)MVar11);
    MVar11 = vector;
  }
  bVar16 = MVar14 == MVar11;
  uVar13 = (uint7)((ulong)unaff_RBP >> 8);
  if (bVar16) {
    MVar11 = MVar14;
    if (~complexArray < MVar14) {
      if (MVar14 != complexArray) {
        if (MVar14 != object) goto LAB_001cab97;
        bVar16 = Object::operator==((elementType->content).object,local_98);
        uVar13 = extraout_var & 0xffffff;
        goto LAB_001cabac;
      }
      bVar16 = AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::operator==
                         ((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)
                          (elementType->content).object,
                          (AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)
                          local_98);
      uVar13 = extraout_var_00 & 0xffffff;
LAB_001cabe9:
      if (local_98 == (Object *)0x0) goto LAB_001cac03;
      AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::~AllocatedVector
                ((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)local_98);
LAB_001cabfb:
      free(local_98);
      goto LAB_001cac03;
    }
    if (MVar14 == vector) {
      if (((elementType->content).vector.elementType == (MainType)local_98) &&
         ((elementType->content).vector.numElements == uVar4)) goto LAB_001cabd0;
    }
    else if (MVar14 != primitiveArray) goto LAB_001cab97;
  }
  else {
LAB_001cab97:
    if ((char)MVar11 < '\0') {
      if (MVar11 == object) {
LAB_001cabac:
        if (local_98 != (Object *)0x0) {
          Object::~Object(local_98);
          goto LAB_001cabfb;
        }
      }
      else if (MVar11 == complexArray) goto LAB_001cabe9;
    }
LAB_001cac03:
    if (bVar16 != false) {
LAB_001cabd0:
      puVar1 = &(this->content).vector.numElements;
      *puVar1 = *puVar1 + numElementsToAdd;
      return;
    }
  }
  if ((this->content).vector.numElements != 0) {
    this->mainType = complexArray;
    pAVar10 = this->allocator;
    if (pAVar10 == (Allocator *)0x0) {
      this_00 = (AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)malloc(0x18);
      pAVar10 = (Allocator *)0x0;
    }
    else {
      this_00 = (AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)
                (**(code **)(*(long *)pAVar10 + 0x10))(pAVar10,0x18);
      pAVar10 = this->allocator;
    }
    this_00->items = (RepeatedGroup *)0x0;
    this_00->size = 0;
    this_00->capacity = 0;
    this_00->allocator = pAVar10;
    uVar5 = (this->content).vector.numElements;
    uVar4 = (this->content).primitiveArray.numVectorElements;
    MVar14 = (this->content).vector.elementType;
    local_48 = (Object *)0x0;
    if (uVar4 != 0) {
      if (0x100 < uVar4) {
LAB_001caec4:
        throwError("Too many vector elements");
      }
      local_48 = (Object *)CONCAT44(uVar4,(uint)MVar14);
      MVar14 = vector;
    }
    AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::reserve(this_00,1);
    pRVar7 = this_00->items;
    uVar4 = this_00->size;
    pRVar7[uVar4].repetitions = uVar5;
    pRVar7[uVar4].elementType.mainType = MVar14;
    pCVar3 = &pRVar7[uVar4].elementType.content;
    pCVar3->object = local_48;
    (&pCVar3->object)[1] = pOStack_40;
    pRVar7[uVar4].elementType.allocator = (Allocator *)0x0;
    this_00->size = this_00->size + 1;
    (this->content).complexArray = (ComplexArray *)this_00;
LAB_001cad6c:
    ComplexArray::addElements((ComplexArray *)this_00,elementType,numElementsToAdd);
    return;
  }
  MVar14 = elementType->mainType;
  uVar12 = CONCAT71(uVar13,MVar14);
  uVar4 = (elementType->content).vector.numElements;
  pOVar15 = (elementType->content).object;
  pOVar8 = *(Object **)((long)&elementType->content + 8);
  pAVar10 = elementType->allocator;
  elementType->mainType = void_;
  if (0xfffff < numElementsToAdd) {
    throwError("Too many array elements");
  }
  pMVar6 = (MemberNameAndType *)this->allocator;
  uVar9 = (uint)MVar14;
  if (uVar9 < 0x31) {
    if ((0x1100112UL >> ((ulong)uVar9 & 0x3f) & 1) == 0) {
      if ((ulong)uVar9 != 0x30) goto LAB_001cadd8;
      local_68 = (byte)*(undefined4 *)&elementType->content;
      uVar12 = (ulong)uVar4;
      this_01 = (Object *)((ulong)numElementsToAdd << 0x20 | (ulong)local_68);
    }
    else {
      this_01 = (Object *)((ulong)numElementsToAdd << 0x20 | (ulong)MVar14);
      uVar12 = 0;
    }
    MVar14 = primitiveArray;
  }
  else {
LAB_001cadd8:
    if (pMVar6 == (MemberNameAndType *)0x0) {
      this_01 = (Object *)malloc(0x18);
    }
    else {
      this_01 = (Object *)(**(code **)((pMVar6->name)._M_len + 0x10))(pMVar6,0x18);
    }
    (this_01->className)._M_len = 0;
    (this_01->className)._M_str = (char *)0x0;
    (this_01->members).items = pMVar6;
    AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::reserve
              ((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)this_01,1);
    pRVar7 = (RepeatedGroup *)(this_01->className)._M_len;
    uVar4 = *(uint *)&(this_01->className)._M_str;
    pRVar7[uVar4].repetitions = numElementsToAdd;
    pRVar7[uVar4].elementType.mainType = MVar14;
    pCVar3 = &pRVar7[uVar4].elementType.content;
    pCVar3->object = pOVar15;
    (&pCVar3->object)[1] = pOVar8;
    pRVar7[uVar4].elementType.allocator = pAVar10;
    ppcVar2 = &(this_01->className)._M_str;
    *(uint32_t *)ppcVar2 = *(uint32_t *)ppcVar2 + 1;
    MVar14 = complexArray;
  }
  MVar11 = this->mainType;
  if ((char)MVar11 < '\0') {
    if (MVar11 == object) {
      pOVar15 = (this->content).object;
      if (pOVar15 == (Object *)0x0) goto LAB_001cac9d;
      local_78 = this->allocator;
      Object::~Object(pOVar15);
    }
    else {
      if ((MVar11 != complexArray) || (pOVar15 = (this->content).object, pOVar15 == (Object *)0x0))
      goto LAB_001cac9d;
      local_78 = this->allocator;
      AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::~AllocatedVector
                ((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)pOVar15);
    }
    if (local_78 == (Allocator *)0x0) {
      free(pOVar15);
    }
    else {
      (**(code **)(*(long *)local_78 + 0x20))(local_78,pOVar15);
    }
  }
LAB_001cac9d:
  this->mainType = MVar14;
  (this->content).object = this_01;
  *(ulong *)((long)&this->content + 8) = uVar12;
  this->allocator = (Allocator *)pMVar6;
  return;
}

Assistant:

bool isType (Types... types) const noexcept   { return ((mainType == types) || ...); }